

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void CEditor::AddImage(char *pFileName,int StorageType,void *pUser)

{
  int iVar1;
  int iVar2;
  IGraphics *pIVar3;
  void *__dest;
  CEditor *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  CEditor *pEditor;
  CEditorImage *pImg;
  char aBuf [128];
  CEditorImage ImgInfo;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd1c;
  CEditorImage *in_stack_fffffffffffffd20;
  CEditorImage *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int local_280;
  int local_27c;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb8;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  undefined8 local_1a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CEditorImage::CEditorImage
            (in_stack_fffffffffffffd20,
             (CEditor *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  pIVar3 = Graphics(in_RDX);
  iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0xe])
                    (pIVar3,&local_1b8,in_RDI,(ulong)in_ESI);
  if (iVar1 != 0) {
    ExtractName((char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    for (local_27c = 0;
        iVar1 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                          (&(in_RDX->m_Map).m_lImages), local_27c < iVar1; local_27c = local_27c + 1
        ) {
      array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                (&(in_RDX->m_Map).m_lImages,local_27c);
      iVar1 = str_comp((char *)in_stack_fffffffffffffd20,
                       (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      if (iVar1 == 0) goto LAB_001f719e;
    }
    __dest = operator_new(0x1b0);
    CEditorImage::CEditorImage
              (in_stack_fffffffffffffd20,
               (CEditor *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    memcpy(__dest,&local_1b8,0x1b0);
    pIVar3 = Graphics(in_RDX);
    uVar4 = 8;
    iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                      (pIVar3,(ulong)local_1b8,(ulong)local_1b4,(ulong)local_1b0,local_1a8,
                       0xffffffff);
    *(int *)((long)__dest + 0x20) = iVar1;
    local_1a8 = 0;
    *(undefined4 *)((long)__dest + 0x24) = 1;
    str_copy((char *)in_stack_fffffffffffffd20,(char *)CONCAT44(in_stack_fffffffffffffd1c,uVar4),0);
    CEditorImage::LoadAutoMapper((CEditorImage *)CONCAT44(in_ESI,in_stack_fffffffffffffda8));
    array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add
              ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
               in_stack_fffffffffffffd20,(CEditorImage **)CONCAT44(in_stack_fffffffffffffd1c,uVar4))
    ;
    SortImages((CEditor *)CONCAT44(iVar1,in_stack_fffffffffffffdb8));
    if (-1 < in_RDX->m_SelectedImage) {
      iVar1 = in_RDX->m_SelectedImage;
      iVar2 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                        (&(in_RDX->m_Map).m_lImages);
      if (iVar1 < iVar2) {
        for (local_280 = 0; local_280 <= in_RDX->m_SelectedImage; local_280 = local_280 + 1) {
          in_stack_fffffffffffffd30 =
               (CEditorImage *)
               array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                         (&(in_RDX->m_Map).m_lImages,local_280);
          iVar1 = str_comp((char *)in_stack_fffffffffffffd20,
                           (char *)CONCAT44(in_stack_fffffffffffffd1c,uVar4));
          if (iVar1 == 0) {
            in_RDX->m_SelectedImage = in_RDX->m_SelectedImage + 1;
            break;
          }
        }
      }
    }
    in_RDX->m_Dialog = 0;
  }
LAB_001f719e:
  CEditorImage::~CEditorImage(in_stack_fffffffffffffd30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::AddImage(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor *)pUser;
	CEditorImage ImgInfo(pEditor);
	if(!pEditor->Graphics()->LoadPNG(&ImgInfo, pFileName, StorageType))
		return;

	// check if we have that image already
	char aBuf[128];
	ExtractName(pFileName, aBuf, sizeof(aBuf));
	for(int i = 0; i < pEditor->m_Map.m_lImages.size(); ++i)
	{
		if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, aBuf))
			return;
	}

	CEditorImage *pImg = new CEditorImage(pEditor);
	*pImg = ImgInfo;
	pImg->m_Texture = pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
	ImgInfo.m_pData = 0;
	pImg->m_External = 1;	// external by default
	str_copy(pImg->m_aName, aBuf, sizeof(pImg->m_aName));
	pImg->LoadAutoMapper();
	pEditor->m_Map.m_lImages.add(pImg);
	pEditor->SortImages();
	if(pEditor->m_SelectedImage > -1 && pEditor->m_SelectedImage < pEditor->m_Map.m_lImages.size())
	{
		for(int i = 0; i <= pEditor->m_SelectedImage; ++i)
			if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, aBuf))
			{
				pEditor->m_SelectedImage++;
				break;
			}
	}
	pEditor->m_Dialog = DIALOG_NONE;
}